

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_array.c
# Opt level: O1

void parse_array_should_parse_arrays_with_one_element(void)

{
  assert_parse_array("[1]");
  if (item[0].child == (cJSON *)0x0) {
    UnityFail("Item doesn\'t have a child.",0x51);
  }
  UnityAssertBits(0xff,8,(long)(item[0].child)->type,"Item doesn\'t have expected type.",0x52);
  reset(item);
  assert_parse_array("[\"hello!\"]");
  if (item[0].child == (cJSON *)0x0) {
    UnityFail("Item doesn\'t have a child.",0x56);
  }
  UnityAssertBits(0xff,0x10,(long)(item[0].child)->type,"Item doesn\'t have expected type.",0x57);
  UnityAssertEqualString("hello!",(item[0].child)->valuestring,0,0x58);
  reset(item);
  assert_parse_array("[[]]");
  if (item[0].child == (cJSON *)0x0) {
    UnityFail("Item doesn\'t have a child.",0x5c);
  }
  assert_is_array(item[0].child);
  if ((item[0].child)->child != (cJSON *)0x0) {
    UnityFail("Item has a child.",0x5e);
  }
  reset(item);
  assert_parse_array("[null]");
  if (item[0].child == (cJSON *)0x0) {
    UnityFail("Item doesn\'t have a child.",0x62);
  }
  UnityAssertBits(0xff,4,(long)(item[0].child)->type,"Item doesn\'t have expected type.",99);
  reset(item);
  return;
}

Assistant:

static void parse_array_should_parse_arrays_with_one_element(void)
{

    assert_parse_array("[1]");
    assert_has_child(item);
    assert_has_type(item->child, cJSON_Number);
    reset(item);

    assert_parse_array("[\"hello!\"]");
    assert_has_child(item);
    assert_has_type(item->child, cJSON_String);
    TEST_ASSERT_EQUAL_STRING("hello!", item->child->valuestring);
    reset(item);

    assert_parse_array("[[]]");
    assert_has_child(item);
    assert_is_array(item->child);
    assert_has_no_child(item->child);
    reset(item);

    assert_parse_array("[null]");
    assert_has_child(item);
    assert_has_type(item->child, cJSON_NULL);
    reset(item);
}